

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelCalibrationHelper.cpp
# Opt level: O0

bool __thiscall
iDynTree::ModelCalibrationHelper::updateModelInertialParametersToString
          (ModelCalibrationHelper *this,string *model_string,VectorDynSize *inertialParams,
          string *filetype,ModelExporterOptions *options)

{
  int iVar1;
  Model *pMVar2;
  pointer pMVar3;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  bool bVar4;
  string *in_stack_00000018;
  string *in_stack_00000020;
  ModelExporter *in_stack_00000028;
  bool ok;
  Model exportedModel;
  ModelExporterOptions *in_stack_fffffffffffffdc0;
  bool local_22a;
  ModelExporter *this_00;
  ModelExporterOptions *this_01;
  string local_1f8 [128];
  undefined4 local_178;
  bool local_161;
  Model local_160 [351];
  byte local_1;
  
  this_01 = (ModelExporterOptions *)CONCAT71(in_register_00000009,in_CL);
  pMVar2 = model((ModelCalibrationHelper *)0x18d15b);
  iDynTree::Model::Model(local_160,pMVar2);
  local_161 = (bool)iDynTree::Model::updateInertialParameters((VectorDynSize *)local_160);
  local_161 = (bool)(local_161 & 1);
  if (local_161 == false) {
    iDynTree::reportError
              ("ModelCalibrationHelper","updateModelInertialParametersToString",
               "Error in iDynTree::Model::updateInertialParameters method.");
    local_1 = 0;
  }
  else {
    pMVar3 = std::
             unique_ptr<iDynTree::ModelCalibrationHelper::ModelCalibrationHelperPimpl,_std::default_delete<iDynTree::ModelCalibrationHelper::ModelCalibrationHelperPimpl>_>
             ::operator->((unique_ptr<iDynTree::ModelCalibrationHelper::ModelCalibrationHelperPimpl,_std::default_delete<iDynTree::ModelCalibrationHelper::ModelCalibrationHelperPimpl>_>
                           *)0x18d1f6);
    this_00 = &pMVar3->modelExporter;
    ModelExporterOptions::ModelExporterOptions(this_01,(ModelExporterOptions *)this_00);
    iVar1 = ModelExporter::init(this_00,(EVP_PKEY_CTX *)local_160);
    local_161 = (bool)((byte)iVar1 & 1);
    ModelExporterOptions::~ModelExporterOptions(in_stack_fffffffffffffdc0);
    bVar4 = (local_161 & 1U) != 0;
    local_22a = false;
    if (bVar4) {
      std::
      unique_ptr<iDynTree::ModelCalibrationHelper::ModelCalibrationHelperPimpl,_std::default_delete<iDynTree::ModelCalibrationHelper::ModelCalibrationHelperPimpl>_>
      ::operator->((unique_ptr<iDynTree::ModelCalibrationHelper::ModelCalibrationHelperPimpl,_std::default_delete<iDynTree::ModelCalibrationHelper::ModelCalibrationHelperPimpl>_>
                    *)0x18d265);
      std::__cxx11::string::string(local_1f8,(string *)this_01);
      local_22a = ModelExporter::exportModelToString
                            (in_stack_00000028,in_stack_00000020,in_stack_00000018);
    }
    local_161 = local_22a;
    if (bVar4) {
      std::__cxx11::string::~string(local_1f8);
    }
    if ((local_161 & 1U) == 0) {
      iDynTree::reportError
                ("ModelCalibrationHelper","updateModelInertialParametersToString",
                 "Error in ModelExporter::exportModelToString method.");
      local_1 = 0;
    }
    else {
      local_1 = 1;
    }
  }
  local_178 = 1;
  iDynTree::Model::~Model(local_160);
  return (bool)(local_1 & 1);
}

Assistant:

bool ModelCalibrationHelper::updateModelInertialParametersToString(std::string & model_string, 
                                                                       const iDynTree::VectorDynSize& inertialParams,
                                                                       const std::string filetype,
                                                                       const ModelExporterOptions options)
    {
        Model exportedModel = this->model();
        
        bool ok = exportedModel.updateInertialParameters(inertialParams);
        if (!ok) {
            reportError("ModelCalibrationHelper", "updateModelInertialParametersToString", "Error in iDynTree::Model::updateInertialParameters method.");
            return false;
        }
        
        ok = m_pimpl->modelExporter.init(exportedModel, options);
        ok = ok && m_pimpl->modelExporter.exportModelToString(model_string, filetype);
        if (!ok) {
            reportError("ModelCalibrationHelper", "updateModelInertialParametersToString", "Error in ModelExporter::exportModelToString method.");
            return false;
        }

        return true;
    }